

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Preprocessor::handleDefaultNetTypeDirective(Preprocessor *this,Token directive)

{
  bool bVar1;
  TokenKind TVar2;
  SourceLocation SVar3;
  DefaultNetTypeDirectiveSyntax *syntax;
  uint uVar4;
  Token TVar5;
  string_view sVar6;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  Token local_58;
  Token directive_local;
  Token local_38;
  Trivia local_28;
  
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  Token::Token(&local_58);
  TVar5 = peek(this);
  uVar4 = TVar5.kind - 0x132;
  if ((uVar4 < 0x21) && ((0x12081003fU >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
    local_58 = consume(this);
    TVar2 = local_58.kind;
  }
  else {
    if (TVar5.kind != Identifier) goto LAB_0058491d;
    local_38 = peek(this);
    sVar6 = Token::rawText(&local_38);
    __y._M_str = "none";
    __y._M_len = 4;
    bVar1 = std::operator==(sVar6,__y);
    if (!bVar1) goto LAB_0058491d;
    local_58 = consume(this);
    TVar2 = Unknown;
  }
  this->defaultNetType = TVar2;
LAB_0058491d:
  if (local_58.info == (Info *)0x0) {
    SVar3 = Token::location(&directive_local);
    sVar6 = Token::rawText(&directive_local);
    SVar3 = (SourceLocation)((long)SVar3 + sVar6._M_len * 0x10000000);
    addDiag(this,(DiagCode)0x70004,SVar3);
    local_58 = Token::createMissing(this->alloc,WireKeyword,SVar3);
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::DefaultNetTypeDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&directive_local,&local_58);
  Trivia::Trivia(&local_28,Directive,(SyntaxNode *)syntax);
  return local_28;
}

Assistant:

Trivia Preprocessor::handleDefaultNetTypeDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token netType;
    switch (peek().kind) {
        case TokenKind::WireKeyword:
        case TokenKind::UWireKeyword:
        case TokenKind::WAndKeyword:
        case TokenKind::WOrKeyword:
        case TokenKind::TriKeyword:
        case TokenKind::Tri0Keyword:
        case TokenKind::Tri1Keyword:
        case TokenKind::TriAndKeyword:
        case TokenKind::TriOrKeyword:
        case TokenKind::TriRegKeyword:
            netType = consume();
            defaultNetType = netType.kind;
            break;
        case TokenKind::Identifier:
            // none isn't a keyword but it's special here
            if (peek().rawText() == "none") {
                netType = consume();
                defaultNetType = TokenKind::Unknown;
            }
            break;
        default:
            break;
    }

    if (!netType) {
        auto loc = directive.location() + directive.rawText().length();
        addDiag(diag::ExpectedNetType, loc);
        netType = Token::createMissing(alloc, TokenKind::WireKeyword, loc);
    }

    auto result = alloc.emplace<DefaultNetTypeDirectiveSyntax>(directive, netType);
    return Trivia(TriviaKind::Directive, result);
}